

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_1be885c::Impl::send(Impl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ssize_t sVar2;
  undefined8 extraout_RAX;
  GenericResponseHandler *handler;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  string local_c0;
  undefined4 local_a0;
  anon_class_24_3_791245ee local_90;
  function<bool_(dap::FieldSerializer_*)> local_78;
  undefined1 local_58 [8];
  Serializer s;
  int seq;
  GenericResponseHandler *responseHandler_local;
  void *request_local;
  TypeInfo *responseTypeInfo_local;
  TypeInfo *requestTypeInfo_local;
  Impl *this_local;
  
  responseTypeInfo_local = (TypeInfo *)CONCAT44(in_register_00000034,__fd);
  handler = (GenericResponseHandler *)CONCAT44(in_register_00000084,__flags);
  responseHandler_local = (GenericResponseHandler *)__n;
  request_local = __buf;
  requestTypeInfo_local = (TypeInfo *)this;
  s._20_4_ = std::__atomic_base<unsigned_int>::operator++
                       (&(this->nextSeq).super___atomic_base<unsigned_int>,0);
  EventHandlers::put(&this->handlers,s._20_4_,(TypeInfo *)request_local,handler);
  dap::json::JsonCppSerializer::JsonCppSerializer((JsonCppSerializer *)local_58);
  local_90.seq = (int *)&s.field_0x14;
  local_90.requestTypeInfo = &responseTypeInfo_local;
  local_90.request = &responseHandler_local;
  std::function<bool(dap::FieldSerializer*)>::
  function<(anonymous_namespace)::Impl::send(dap::TypeInfo_const*,dap::TypeInfo_const*,void_const*,std::function<void(void_const*,dap::Error_const*)>const&)::_lambda(dap::FieldSerializer*)_1_,void>
            ((function<bool(dap::FieldSerializer*)> *)&local_78,&local_90);
  bVar1 = dap::json::JsonCppSerializer::object((JsonCppSerializer *)local_58,&local_78);
  std::function<bool_(dap::FieldSerializer_*)>::~function(&local_78);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    dap::json::JsonCppSerializer::dump_abi_cxx11_(&local_c0,(JsonCppSerializer *)local_58);
    sVar2 = send(this,(int)&local_c0,__buf_00,(size_t)handler,__flags);
    this_local._7_1_ = (byte)sVar2 & 1;
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    this_local._7_1_ = 0;
  }
  local_a0 = 1;
  dap::json::JsonCppSerializer::~JsonCppSerializer((JsonCppSerializer *)local_58);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

bool send(const dap::TypeInfo* requestTypeInfo,
            const dap::TypeInfo* responseTypeInfo,
            const void* request,
            const GenericResponseHandler& responseHandler) override {
    int seq = nextSeq++;

    handlers.put(seq, responseTypeInfo, responseHandler);

    dap::json::Serializer s;
    if (!s.object([&](dap::FieldSerializer* fs) {
          return fs->field("seq", dap::integer(seq)) &&
                 fs->field("type", "request") &&
                 fs->field("command", requestTypeInfo->name()) &&
                 fs->field("arguments", [&](dap::Serializer* s) {
                   return requestTypeInfo->serialize(s, request);
                 });
        })) {
      return false;
    }
    return send(s.dump());
  }